

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dobject.h
# Opt level: O2

PClassPointer * dyn_cast<PClassPointer>(DObject *p)

{
  bool bVar1;
  
  if ((p != (DObject *)0x0) &&
     (bVar1 = DObject::IsKindOf(p,PClassPointer::RegistrationInfo.MyClass), bVar1)) {
    return (PClassPointer *)p;
  }
  return (PClassPointer *)0x0;
}

Assistant:

T *dyn_cast(DObject *p)
{
	if (p != NULL && p->IsKindOf(RUNTIME_CLASS_CASTLESS(T)))
	{
		return static_cast<T *>(p);
	}
	return NULL;
}